

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void RcTree_ReverseEncode(CRangeEnc *rc,UInt16 *probs,int numBitLevels,UInt32 symbol)

{
  uint uVar1;
  uint in_ECX;
  int in_EDX;
  CRangeEnc *in_RSI;
  UInt32 bit;
  int i;
  UInt32 m;
  undefined4 local_20;
  uint symbol_00;
  
  symbol_00 = 1;
  for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
    uVar1 = in_ECX & 1;
    RangeEnc_EncodeBit(in_RSI,(UInt16 *)CONCAT44(in_EDX,in_ECX),symbol_00);
    symbol_00 = symbol_00 << 1 | uVar1;
    in_ECX = in_ECX >> 1;
  }
  return;
}

Assistant:

static void RcTree_ReverseEncode(CRangeEnc *rc, CLzmaProb *probs, int numBitLevels, UInt32 symbol)
{
  UInt32 m = 1;
  int i;
  for (i = 0; i < numBitLevels; i++)
  {
    UInt32 bit = symbol & 1;
    RangeEnc_EncodeBit(rc, probs + m, bit);
    m = (m << 1) | bit;
    symbol >>= 1;
  }
}